

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArchiveBuilder.cpp
# Opt level: O2

bool __thiscall ZAP::ArchiveBuilder::removeFile(ArchiveBuilder *this,string *virtual_path)

{
  _Rb_tree_header *p_Var1;
  __type _Var2;
  const_iterator __position;
  
  __position._M_node = (this->files)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->files)._M_t._M_impl.super__Rb_tree_header;
  do {
    if ((_Rb_tree_header *)__position._M_node == p_Var1) {
LAB_00106789:
      return (_Rb_tree_header *)__position._M_node != p_Var1;
    }
    _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (__position._M_node + 2),virtual_path);
    if (_Var2) {
      std::
      _Rb_tree<ZAP::ArchiveBuilder::Entry,ZAP::ArchiveBuilder::Entry,std::_Identity<ZAP::ArchiveBuilder::Entry>,std::less<ZAP::ArchiveBuilder::Entry>,std::allocator<ZAP::ArchiveBuilder::Entry>>
      ::erase_abi_cxx11_((_Rb_tree<ZAP::ArchiveBuilder::Entry,ZAP::ArchiveBuilder::Entry,std::_Identity<ZAP::ArchiveBuilder::Entry>,std::less<ZAP::ArchiveBuilder::Entry>,std::allocator<ZAP::ArchiveBuilder::Entry>>
                          *)this,__position);
      goto LAB_00106789;
    }
    __position._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
  } while( true );
}

Assistant:

bool ArchiveBuilder::removeFile(const std::string &virtual_path)
	{
		for (FileList::iterator it = files.begin(); it != files.end(); ++it)
		{
			const Entry &entry = (*it);
			if (entry.virtual_path == virtual_path)
			{
				files.erase(it);
				return true;
			}
		}
		return false;
	}